

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O1

BOOL __thiscall
Js::TypedArray<char,_false,_false>::DirectSetItemAtRange
          (TypedArray<char,_false,_false> *this,TypedArray<char,_false,_false> *fromArray,
          int32 iSrcStart,int32 iDstStart,uint32 length,_func_char_Var_ScriptContext_ptr *convFunc)

{
  Type puVar1;
  Type puVar2;
  JavascriptLibrary *pJVar3;
  code *pcVar4;
  bool bVar5;
  byte bVar6;
  undefined4 *puVar7;
  size_t count;
  uint uVar8;
  uint uVar9;
  size_t sizeInBytes;
  
  puVar1 = (this->super_TypedArrayBase).buffer;
  puVar2 = (fromArray->super_TypedArrayBase).buffer;
  if (puVar2 == (Type)0x0 || puVar1 == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x156,"(srcBuffer && dstBuffer)","srcBuffer && dstBuffer");
    if (!bVar5) goto LAB_00ad2d33;
    *puVar7 = 0;
  }
  if ((int)length < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x157,
                                "(length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName))",
                                "length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName)");
    if (!bVar5) goto LAB_00ad2d33;
    *puVar7 = 0;
  }
  if (iSrcStart != iDstStart) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x159,"(iSrcStart == iDstStart)","iSrcStart == iDstStart");
    if (!bVar5) {
LAB_00ad2d33:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  if ((((this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached != false)
     || (((fromArray->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached ==
         true)) {
    JavascriptError::ThrowTypeError
              ((((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                   super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
  }
  if (iDstStart < 0) {
    if ((long)((long)iDstStart + (ulong)length) < 0) {
      return 1;
    }
    length = length + iDstStart;
    iDstStart = 0;
  }
  if (!CARRY4(length,iDstStart)) {
    uVar9 = (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
    sizeInBytes = (size_t)(uVar9 - iDstStart);
    if (uVar9 < (uint)iDstStart) {
      sizeInBytes = 0;
    }
    if (length + iDstStart < uVar9) {
      sizeInBytes = (size_t)length;
    }
    uVar9 = (fromArray->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
    uVar8 = uVar9 - iDstStart;
    if (uVar9 < (uint)iDstStart) {
      uVar8 = 0;
    }
    if (length + iDstStart < uVar9) {
      uVar8 = length;
    }
    if (length < uVar8) {
      uVar8 = length;
    }
    uVar9 = (uint)sizeInBytes;
    count = sizeInBytes;
    if (uVar8 < uVar9) {
      count = (size_t)uVar8;
    }
    js_memcpy_s(puVar1 + (uint)iDstStart,sizeInBytes,puVar2 + (uint)iDstStart,count);
    if (uVar8 < uVar9) {
      pJVar3 = (((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                 super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr;
      bVar6 = (*convFunc)((pJVar3->super_JavascriptLibraryBase).undefinedValue.ptr,
                          (pJVar3->super_JavascriptLibraryBase).scriptContext.ptr);
      memset(puVar1 + count,(uint)bVar6,(ulong)(uVar9 + ~(uint)count) + 1);
    }
    return 1;
  }
  ::Math::DefaultOverflowPolicy();
}

Assistant:

inline BOOL DirectSetItemAtRange(TypedArray *fromArray, __in int32 iSrcStart, __in int32 iDstStart, __in uint32 length, TypeName(*convFunc)(Var value, ScriptContext* scriptContext))
        {
            TypeName* dstBuffer = (TypeName*)buffer;
            TypeName* srcBuffer = (TypeName*)fromArray->buffer;
            Assert(srcBuffer && dstBuffer);
            Assert(length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName));
            // caller checks that src and dst index are the same
            Assert(iSrcStart == iDstStart);

            if (this->IsDetachedBuffer() || fromArray->IsDetachedBuffer())
            {
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
            }

            // Fixup destination start in case it's negative
            uint32 start = iDstStart;
            if (iDstStart < 0)
            {
                if ((int64)(length) + iDstStart < 0)
                {
                    // nothing to do, all index are no-op
                    return true;
                }

                length += iDstStart;
                start = 0;
            }

            uint32 dstLength = UInt32Math::Add(start, length) < GetLength() ? length : GetLength() > start ? GetLength() - start : 0;
            uint32 srcLength = start + length < fromArray->GetLength() ? length : (fromArray->GetLength() > start ? fromArray->GetLength() - start : 0);

            // length is the minimum of length, srcLength and dstLength
            length = length < srcLength ? (length < dstLength ? length : dstLength) : (srcLength < dstLength ? srcLength : dstLength);

            const size_t byteSize = sizeof(TypeName) * length;
            Assert(byteSize >= length); // check for overflow
            js_memcpy_s(dstBuffer + start, dstLength * sizeof(TypeName), srcBuffer + start, byteSize);

            if (dstLength > length)
            {
                TypeName undefinedValue = convFunc(GetLibrary()->GetUndefined(), GetScriptContext());
                for (uint32 i = length; i < dstLength; i++)
                {
                    dstBuffer[i] = undefinedValue;
                }
            }

            return true;
        }